

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqstdrex.cpp
# Opt level: O0

SQInteger sqstd_rex_class(SQRex *exp)

{
  char *pcVar1;
  SQChar SVar2;
  SQRex *exp_00;
  SQRex *pSVar3;
  long *in_RDI;
  SQInteger c_1;
  SQInteger c;
  SQInteger t;
  SQInteger r;
  SQInteger chain;
  SQInteger first;
  SQInteger ret;
  undefined7 in_stack_ffffffffffffffb8;
  undefined1 in_stack_ffffffffffffffbf;
  undefined1 uVar4;
  SQRex *in_stack_ffffffffffffffc0;
  SQBool in_stack_ffffffffffffffd0;
  SQRex *in_stack_ffffffffffffffd8;
  SQRex *local_20;
  SQRex *pSVar5;
  
  pSVar5 = (SQRex *)0xffffffffffffffff;
  if (*(char *)in_RDI[2] == '^') {
    exp_00 = (SQRex *)sqstd_rex_newnode((SQRex *)0xffffffffffffffff,-1);
    in_RDI[2] = in_RDI[2] + 1;
  }
  else {
    exp_00 = (SQRex *)sqstd_rex_newnode((SQRex *)0xffffffffffffffff,-1);
  }
  local_20 = exp_00;
  if (*(char *)in_RDI[2] == ']') {
    sqstd_rex_error(in_stack_ffffffffffffffc0,
                    (SQChar *)CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8));
    local_20 = exp_00;
  }
  while( true ) {
    uVar4 = false;
    if (*(char *)in_RDI[2] != ']') {
      uVar4 = in_RDI[2] != *in_RDI;
    }
    if ((bool)uVar4 == false) break;
    if ((*(char *)in_RDI[2] == '-') && (pSVar5 != (SQRex *)0xffffffffffffffff)) {
      pcVar1 = (char *)in_RDI[2];
      in_RDI[2] = (long)(pcVar1 + 1);
      if (*pcVar1 == ']') {
        sqstd_rex_error(in_stack_ffffffffffffffc0,
                        (SQChar *)CONCAT17(uVar4,in_stack_ffffffffffffffb8));
      }
      in_stack_ffffffffffffffd8 =
           (SQRex *)sqstd_rex_newnode(exp_00,(SQRexNodeType)((ulong)pSVar5 >> 0x20));
      if ((int)*(char *)in_RDI[2] < *(int *)(in_RDI[5] + (long)pSVar5 * 0x20)) {
        sqstd_rex_error(in_stack_ffffffffffffffc0,
                        (SQChar *)CONCAT17(uVar4,in_stack_ffffffffffffffb8));
      }
      if (*(int *)(in_RDI[5] + (long)pSVar5 * 0x20) == 0x106) {
        sqstd_rex_error(in_stack_ffffffffffffffc0,
                        (SQChar *)CONCAT17(uVar4,in_stack_ffffffffffffffb8));
      }
      *(long *)(in_RDI[5] + (long)in_stack_ffffffffffffffd8 * 0x20 + 8) =
           (long)*(int *)(in_RDI[5] + (long)pSVar5 * 0x20);
      SVar2 = sqstd_rex_escapechar((SQRex *)CONCAT17(uVar4,in_stack_ffffffffffffffb8));
      in_stack_ffffffffffffffd0 = (SQBool)SVar2;
      *(SQBool *)(in_RDI[5] + (long)in_stack_ffffffffffffffd8 * 0x20 + 0x10) =
           in_stack_ffffffffffffffd0;
      *(SQRex **)(in_RDI[5] + (long)local_20 * 0x20 + 0x18) = in_stack_ffffffffffffffd8;
      local_20 = in_stack_ffffffffffffffd8;
      pSVar5 = (SQRex *)0xffffffffffffffff;
    }
    else if (pSVar5 == (SQRex *)0xffffffffffffffff) {
      pSVar5 = (SQRex *)sqstd_rex_charnode(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
    }
    else {
      *(SQRex **)(in_RDI[5] + (long)local_20 * 0x20 + 0x18) = pSVar5;
      pSVar3 = (SQRex *)sqstd_rex_charnode(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
      local_20 = pSVar5;
      pSVar5 = pSVar3;
    }
  }
  if (pSVar5 != (SQRex *)0xffffffffffffffff) {
    *(SQRex **)(in_RDI[5] + (long)local_20 * 0x20 + 0x18) = pSVar5;
  }
  *(undefined8 *)(in_RDI[5] + (long)exp_00 * 0x20 + 8) =
       *(undefined8 *)(in_RDI[5] + (long)exp_00 * 0x20 + 0x18);
  *(undefined8 *)(in_RDI[5] + (long)exp_00 * 0x20 + 0x18) = 0xffffffffffffffff;
  return (SQInteger)exp_00;
}

Assistant:

static SQInteger sqstd_rex_class(SQRex *exp)
{
    SQInteger ret = -1;
    SQInteger first = -1,chain;
    if(*exp->_p == SQREX_SYMBOL_BEGINNING_OF_STRING){
        ret = sqstd_rex_newnode(exp,OP_NCLASS);
        exp->_p++;
    }else ret = sqstd_rex_newnode(exp,OP_CLASS);

    if(*exp->_p == ']') sqstd_rex_error(exp,_SC("empty class"));
    chain = ret;
    while(*exp->_p != ']' && exp->_p != exp->_eol) {
        if(*exp->_p == '-' && first != -1){
            SQInteger r;
            if(*exp->_p++ == ']') sqstd_rex_error(exp,_SC("unfinished range"));
            r = sqstd_rex_newnode(exp,OP_RANGE);
            if(exp->_nodes[first].type>*exp->_p) sqstd_rex_error(exp,_SC("invalid range"));
            if(exp->_nodes[first].type == OP_CCLASS) sqstd_rex_error(exp,_SC("cannot use character classes in ranges"));
            exp->_nodes[r].left = exp->_nodes[first].type;
            SQInteger t = sqstd_rex_escapechar(exp);
            exp->_nodes[r].right = t;
            exp->_nodes[chain].next = r;
            chain = r;
            first = -1;
        }
        else{
            if(first!=-1){
                SQInteger c = first;
                exp->_nodes[chain].next = c;
                chain = c;
                first = sqstd_rex_charnode(exp,SQTrue);
            }
            else{
                first = sqstd_rex_charnode(exp,SQTrue);
            }
        }
    }
    if(first!=-1){
        SQInteger c = first;
        exp->_nodes[chain].next = c;
    }
    /* hack? */
    exp->_nodes[ret].left = exp->_nodes[ret].next;
    exp->_nodes[ret].next = -1;
    return ret;
}